

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall
Privkey_ConvertWif_testnet_uncompressed_Test::~Privkey_ConvertWif_testnet_uncompressed_Test
          (Privkey_ConvertWif_testnet_uncompressed_Test *this)

{
  Privkey_ConvertWif_testnet_uncompressed_Test *this_local;
  
  ~Privkey_ConvertWif_testnet_uncompressed_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, ConvertWif_testnet_uncompressed) {
  std::string hex =
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27";
  Privkey privkey(hex);
  std::string wif = privkey.ConvertWif(NetType::kTestnet, false);
  EXPECT_STREQ(wif.c_str(),
               "91xDetrgFxon9rHyPGKg5U5Kjttn6JGiGZcfpg3jGH9QPd4tmrm");
}